

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O2

CURLcode rtsp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  Curl_RtspReq CVar1;
  SessionHandle *data;
  void *pvVar2;
  CURLcode CVar3;
  
  data = conn->data;
  pvVar2 = (data->req).protop;
  CVar3 = Curl_http_done(conn,status,(data->set).rtspreq == RTSPREQ_RECEIVE || premature);
  if (pvVar2 != (void *)0x0) {
    CVar1 = (data->set).rtspreq;
    if (*(long *)((long)pvVar2 + 0x88) == *(long *)((long)pvVar2 + 0x90) || CVar1 == RTSPREQ_RECEIVE
       ) {
      if ((CVar1 == RTSPREQ_RECEIVE) && ((conn->proto).rtspc.rtp_channel == -1)) {
        Curl_infof(data,"Got an RTP Receive with a CSeq of %ld\n",*(long *)((long)pvVar2 + 0x90));
      }
    }
    else {
      Curl_failf(data,"The CSeq of this request %ld did not match the response %ld");
      CVar3 = CURLE_RTSP_CSEQ_ERROR;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode rtsp_done(struct connectdata *conn,
                          CURLcode status, bool premature)
{
  struct SessionHandle *data = conn->data;
  struct RTSP *rtsp = data->req.protop;
  CURLcode httpStatus;
  long CSeq_sent;
  long CSeq_recv;

  /* Bypass HTTP empty-reply checks on receive */
  if(data->set.rtspreq == RTSPREQ_RECEIVE)
    premature = TRUE;

  httpStatus = Curl_http_done(conn, status, premature);

  if(rtsp) {
    /* Check the sequence numbers */
    CSeq_sent = rtsp->CSeq_sent;
    CSeq_recv = rtsp->CSeq_recv;
    if((data->set.rtspreq != RTSPREQ_RECEIVE) && (CSeq_sent != CSeq_recv)) {
      failf(data,
            "The CSeq of this request %ld did not match the response %ld",
            CSeq_sent, CSeq_recv);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    else if(data->set.rtspreq == RTSPREQ_RECEIVE &&
            (conn->proto.rtspc.rtp_channel == -1)) {
      infof(data, "Got an RTP Receive with a CSeq of %ld\n", CSeq_recv);
      /* TODO CPC: Server -> Client logic here */
    }
  }

  return httpStatus;
}